

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

timeval __thiscall absl::ToTimeval(absl *this,Time t)

{
  ulong uVar1;
  absl *paVar2;
  ulong uVar3;
  timeval tVar4;
  
  uVar1 = (ulong)t.rep_.rep_hi_ >> 2 & 0x3fffffff;
  paVar2 = (absl *)0x8000000000000000;
  if (-1 < (long)this) {
    paVar2 = (absl *)0x7fffffffffffffff;
  }
  uVar3 = 0x3b9ac9f8;
  if (-1 >= (long)this) {
    uVar3 = 0;
  }
  if ((int)t.rep_.rep_hi_ == -1) {
    uVar1 = uVar3;
    this = paVar2;
  }
  tVar4.tv_usec = uVar1 / 1000;
  tVar4.tv_sec = (__time_t)this;
  return tVar4;
}

Assistant:

timespec ToTimespec(Time t) {
  timespec ts;
  absl::Duration d = time_internal::ToUnixDuration(t);
  if (!time_internal::IsInfiniteDuration(d)) {
    ts.tv_sec = time_internal::GetRepHi(d);
    if (ts.tv_sec == time_internal::GetRepHi(d)) {  // no time_t narrowing
      ts.tv_nsec = time_internal::GetRepLo(d) / 4;  // floor
      return ts;
    }
  }
  if (d >= absl::ZeroDuration()) {
    ts.tv_sec = std::numeric_limits<time_t>::max();
    ts.tv_nsec = 1000 * 1000 * 1000 - 1;
  } else {
    ts.tv_sec = std::numeric_limits<time_t>::min();
    ts.tv_nsec = 0;
  }
  return ts;
}